

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseBlockInstr
          (WastParser *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  bool bVar1;
  TokenType TVar2;
  Result RVar3;
  pointer pBVar4;
  pointer pBVar5;
  pointer pIVar6;
  pointer pIVar7;
  pointer pTVar8;
  unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> local_2c0;
  unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> expr_4;
  Location local_260;
  Enum local_240;
  Enum local_23c;
  Location local_238;
  Enum local_218;
  Enum local_214;
  unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_> local_210;
  unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_> expr_3;
  Location local_1b0;
  Enum local_190;
  Enum local_18c;
  Enum local_188;
  Enum local_184;
  unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> local_180;
  unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> expr_2;
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)22>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)22>_>_>
  local_118;
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)22>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)22>_>_>
  expr_1;
  int local_b0;
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
  local_98;
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
  expr;
  undefined1 local_40 [8];
  Location loc;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr_local;
  WastParser *this_local;
  
  loc.field_1._8_8_ = out_expr;
  GetLocation((Location *)local_40,this);
  TVar2 = Peek(this,0);
  switch(TVar2) {
  case Block:
    Consume((Token *)&expr,this);
    Token::~Token((Token *)&expr);
    MakeUnique<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Location&>
              ((wabt *)&local_98,(Location *)local_40);
    pBVar4 = std::
             unique_ptr<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
             ::operator->(&local_98);
    RVar3 = ParseLabelOpt(this,&(pBVar4->block).label);
    bVar1 = Failed(RVar3);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_b0 = 1;
    }
    else {
      pBVar4 = std::
               unique_ptr<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
               ::operator->(&local_98);
      RVar3 = ParseBlock(this,&pBVar4->block);
      bVar1 = Failed(RVar3);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_b0 = 1;
      }
      else {
        RVar3 = Expect(this,End);
        bVar1 = Failed(RVar3);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_b0 = 1;
        }
        else {
          pBVar4 = std::
                   unique_ptr<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
                   ::operator->(&local_98);
          RVar3 = ParseEndLabelOpt(this,&(pBVar4->block).label);
          bVar1 = Failed(RVar3);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_b0 = 1;
          }
          else {
            std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                      ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)loc.field_1._8_8_,
                       &local_98);
            local_b0 = 2;
          }
        }
      }
    }
    std::
    unique_ptr<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
    ::~unique_ptr(&local_98);
    break;
  default:
    __assert_fail("!\"ParseBlockInstr should only be called when IsBlockInstr() is true\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wast-parser.cc"
                  ,0x72d,"Result wabt::WastParser::ParseBlockInstr(std::unique_ptr<Expr> *)");
  case IfExcept:
    Consume((Token *)&expr_3,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)&expr_3);
    Token::~Token((Token *)&expr_3);
    MakeUnique<wabt::IfExceptExpr,wabt::Location&>((wabt *)&local_210,(Location *)local_40);
    pIVar7 = std::unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>::get
                       (&local_210);
    local_214 = (Enum)ParseIfExceptHeader(this,pIVar7);
    bVar1 = Failed((Result)local_214);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_b0 = 1;
    }
    else {
      pIVar7 = std::unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>::
               operator->(&local_210);
      local_218 = (Enum)ParseInstrList(this,&(pIVar7->true_).exprs);
      bVar1 = Failed((Result)local_218);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_b0 = 1;
      }
      else {
        GetLocation(&local_238,this);
        pIVar7 = std::unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>::
                 operator->(&local_210);
        (pIVar7->true_).end_loc.field_1.field_1.offset = (size_t)local_238.field_1.field_1.offset;
        *(undefined8 *)((long)&(pIVar7->true_).end_loc.field_1 + 8) = local_238.field_1._8_8_;
        (pIVar7->true_).end_loc.filename.data_ = local_238.filename.data_;
        (pIVar7->true_).end_loc.filename.size_ = local_238.filename.size_;
        bVar1 = Match(this,Else);
        if (bVar1) {
          pIVar7 = std::unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>::
                   operator->(&local_210);
          local_23c = (Enum)ParseEndLabelOpt(this,&(pIVar7->true_).label);
          bVar1 = Failed((Result)local_23c);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_b0 = 1;
          }
          else {
            pIVar7 = std::unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>::
                     operator->(&local_210);
            local_240 = (Enum)ParseTerminatingInstrList(this,&pIVar7->false_);
            bVar1 = Failed((Result)local_240);
            if (!bVar1) {
              GetLocation(&local_260,this);
              pIVar7 = std::unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>
                       ::operator->(&local_210);
              (pIVar7->false_end_loc).filename.data_ = local_260.filename.data_;
              (pIVar7->false_end_loc).filename.size_ = local_260.filename.size_;
              (pIVar7->false_end_loc).field_1.field_1.offset =
                   (size_t)local_260.field_1.field_1.offset;
              *(undefined8 *)((long)&(pIVar7->false_end_loc).field_1 + 8) = local_260.field_1._8_8_;
              goto LAB_016e11c5;
            }
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_b0 = 1;
          }
        }
        else {
LAB_016e11c5:
          RVar3 = Expect(this,End);
          bVar1 = Failed(RVar3);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_b0 = 1;
          }
          else {
            pIVar7 = std::unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>::
                     operator->(&local_210);
            RVar3 = ParseEndLabelOpt(this,&(pIVar7->true_).label);
            bVar1 = Failed(RVar3);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              local_b0 = 1;
            }
            else {
              std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                        ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)loc.field_1._8_8_
                         ,&local_210);
              local_b0 = 2;
            }
          }
        }
      }
    }
    std::unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>::~unique_ptr
              (&local_210);
    goto joined_r0x016e0e8d;
  case If:
    Consume((Token *)&expr_2,this);
    Token::~Token((Token *)&expr_2);
    MakeUnique<wabt::IfExpr,wabt::Location&>((wabt *)&local_180,(Location *)local_40);
    pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                       (&local_180);
    local_184 = (Enum)ParseLabelOpt(this,&(pIVar6->true_).label);
    bVar1 = Failed((Result)local_184);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_b0 = 1;
    }
    else {
      pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                         (&local_180);
      local_188 = (Enum)ParseBlock(this,&pIVar6->true_);
      bVar1 = Failed((Result)local_188);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_b0 = 1;
      }
      else {
        bVar1 = Match(this,Else);
        if (bVar1) {
          pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                             (&local_180);
          local_18c = (Enum)ParseEndLabelOpt(this,&(pIVar6->true_).label);
          bVar1 = Failed((Result)local_18c);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_b0 = 1;
          }
          else {
            pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                               (&local_180);
            local_190 = (Enum)ParseTerminatingInstrList(this,&pIVar6->false_);
            bVar1 = Failed((Result)local_190);
            if (!bVar1) {
              GetLocation(&local_1b0,this);
              pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                                 (&local_180);
              (pIVar6->false_end_loc).filename.data_ = local_1b0.filename.data_;
              (pIVar6->false_end_loc).filename.size_ = local_1b0.filename.size_;
              (pIVar6->false_end_loc).field_1.field_1.offset =
                   (size_t)local_1b0.field_1.field_1.offset;
              *(undefined8 *)((long)&(pIVar6->false_end_loc).field_1 + 8) = local_1b0.field_1._8_8_;
              goto LAB_016e0d81;
            }
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_b0 = 1;
          }
        }
        else {
LAB_016e0d81:
          RVar3 = Expect(this,End);
          bVar1 = Failed(RVar3);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_b0 = 1;
          }
          else {
            pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                               (&local_180);
            RVar3 = ParseEndLabelOpt(this,&(pIVar6->true_).label);
            bVar1 = Failed(RVar3);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              local_b0 = 1;
            }
            else {
              std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                        ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)loc.field_1._8_8_
                         ,&local_180);
              local_b0 = 2;
            }
          }
        }
      }
    }
    std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::~unique_ptr(&local_180);
joined_r0x016e0e8d:
    if (local_b0 == 1) {
      return (Result)this_local._4_4_;
    }
    goto LAB_016e16e6;
  case Loop:
    Consume((Token *)&expr_1,this);
    Token::~Token((Token *)&expr_1);
    MakeUnique<wabt::BlockExprBase<(wabt::ExprType)22>,wabt::Location&>
              ((wabt *)&local_118,(Location *)local_40);
    pBVar5 = std::
             unique_ptr<wabt::BlockExprBase<(wabt::ExprType)22>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)22>_>_>
             ::operator->(&local_118);
    RVar3 = ParseLabelOpt(this,&(pBVar5->block).label);
    bVar1 = Failed(RVar3);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_b0 = 1;
    }
    else {
      pBVar5 = std::
               unique_ptr<wabt::BlockExprBase<(wabt::ExprType)22>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)22>_>_>
               ::operator->(&local_118);
      RVar3 = ParseBlock(this,&pBVar5->block);
      bVar1 = Failed(RVar3);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_b0 = 1;
      }
      else {
        RVar3 = Expect(this,End);
        bVar1 = Failed(RVar3);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_b0 = 1;
        }
        else {
          pBVar5 = std::
                   unique_ptr<wabt::BlockExprBase<(wabt::ExprType)22>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)22>_>_>
                   ::operator->(&local_118);
          RVar3 = ParseEndLabelOpt(this,&(pBVar5->block).label);
          bVar1 = Failed(RVar3);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_b0 = 1;
          }
          else {
            std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                      ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)loc.field_1._8_8_,
                       &local_118);
            local_b0 = 2;
          }
        }
      }
    }
    std::
    unique_ptr<wabt::BlockExprBase<(wabt::ExprType)22>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)22>_>_>
    ::~unique_ptr(&local_118);
    break;
  case Try:
    Consume((Token *)&expr_4,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)&expr_4);
    Token::~Token((Token *)&expr_4);
    MakeUnique<wabt::TryExpr,wabt::Location&>((wabt *)&local_2c0,(Location *)local_40);
    pTVar8 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                       (&local_2c0);
    RVar3 = ParseLabelOpt(this,&(pTVar8->block).label);
    bVar1 = Failed(RVar3);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_b0 = 1;
    }
    else {
      pTVar8 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                         (&local_2c0);
      RVar3 = ParseBlock(this,&pTVar8->block);
      bVar1 = Failed(RVar3);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_b0 = 1;
      }
      else {
        RVar3 = Expect(this,Catch);
        bVar1 = Failed(RVar3);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_b0 = 1;
        }
        else {
          pTVar8 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                             (&local_2c0);
          RVar3 = ParseEndLabelOpt(this,&(pTVar8->block).label);
          bVar1 = Failed(RVar3);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_b0 = 1;
          }
          else {
            pTVar8 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                               (&local_2c0);
            RVar3 = ParseTerminatingInstrList(this,&pTVar8->catch_);
            bVar1 = Failed(RVar3);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              local_b0 = 1;
            }
            else {
              RVar3 = Expect(this,End);
              bVar1 = Failed(RVar3);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                local_b0 = 1;
              }
              else {
                pTVar8 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::
                         operator->(&local_2c0);
                RVar3 = ParseEndLabelOpt(this,&(pTVar8->block).label);
                bVar1 = Failed(RVar3);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  local_b0 = 1;
                }
                else {
                  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)
                             loc.field_1._8_8_,&local_2c0);
                  local_b0 = 2;
                }
              }
            }
          }
        }
      }
    }
    std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::~unique_ptr(&local_2c0);
  }
  if (local_b0 != 1) {
LAB_016e16e6:
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseBlockInstr(std::unique_ptr<Expr>* out_expr) {
  WABT_TRACE(ParseBlockInstr);
  Location loc = GetLocation();

  switch (Peek()) {
    case TokenType::Block: {
      Consume();
      auto expr = MakeUnique<BlockExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Loop: {
      Consume();
      auto expr = MakeUnique<LoopExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::If: {
      Consume();
      auto expr = MakeUnique<IfExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
      CHECK_RESULT(ParseBlock(&expr->true_));
      if (Match(TokenType::Else)) {
        CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
        CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
        expr->false_end_loc = GetLocation();
      }
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::IfExcept: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = MakeUnique<IfExceptExpr>(loc);
      CHECK_RESULT(ParseIfExceptHeader(expr.get()));
      CHECK_RESULT(ParseInstrList(&expr->true_.exprs));
      expr->true_.end_loc = GetLocation();
      if (Match(TokenType::Else)) {
        CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
        CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
        expr->false_end_loc = GetLocation();
      }
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Try: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = MakeUnique<TryExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(Catch);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      CHECK_RESULT(ParseTerminatingInstrList(&expr->catch_));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    default:
      assert(
          !"ParseBlockInstr should only be called when IsBlockInstr() is true");
      return Result::Error;
  }

  return Result::Ok;
}